

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O0

void sqlcheck::CheckSelectStar(Configuration *state,string *sql_statement,bool *print_statement)

{
  undefined4 pattern_type_00;
  string local_1b0;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined1 local_110 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> message;
  undefined1 local_e8 [8];
  string message3;
  undefined1 local_c0 [8];
  string message2;
  undefined1 local_98 [8];
  string message1;
  PatternType pattern_type;
  allocator local_61;
  string local_60 [8];
  string title;
  regex pattern;
  bool *print_statement_local;
  string *sql_statement_local;
  Configuration *state_local;
  
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)((long)&title.field_2 + 8),
             "(select\\s+\\*)",0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"SELECT *",&local_61);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  message1.field_2._8_4_ = 3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_98,anon_var_dwarf_902d0,
             (allocator *)(message2.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(message2.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_c0,anon_var_dwarf_902eb,
             (allocator *)(message3.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(message3.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_e8,anon_var_dwarf_90306,
             (allocator *)(message.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(message.field_2._M_local_buf + 0xf));
  std::operator+(&local_170,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,"\n")
  ;
  std::operator+(&local_150,&local_170,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
  std::operator+(&local_130,&local_150,"\n");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                 &local_130,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  pattern_type_00 = message1.field_2._8_4_;
  std::__cxx11::string::string((string *)&local_190,local_60);
  std::__cxx11::string::string((string *)&local_1b0,(string *)local_110);
  CheckPattern(state,sql_statement,print_statement,(regex *)((long)&title.field_2 + 8),
               RISK_LEVEL_HIGH,pattern_type_00,&local_190,&local_1b0,true,0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)local_110);
  std::__cxx11::string::~string((string *)local_e8);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)((long)&title.field_2 + 8));
  return;
}

Assistant:

void CheckSelectStar(Configuration& state,
                     const std::string& sql_statement,
                     bool& print_statement){

  std::regex pattern("(select\\s+\\*)");
  std::string title = "SELECT *";
  PatternType pattern_type = PatternType::PATTERN_TYPE_QUERY;

  std::string message1 =
      "● Inefficiency in moving data to the consumer:  "
      "When you SELECT *, you're often retrieving more columns from the database than "
      "your application really needs to function. This causes more data to move from "
      "the database server to the client, slowing access and increasing load on your "
      "machines, as well as taking more time to travel across the network. This is "
      "especially true when someone adds new columns to underlying tables that didn't "
      "exist and weren't needed when the original consumers coded their data access.";

  std::string message2 =
      "● Indexing issues:  "
      "Consider a scenario where you want to tune a query to a high level of performance. "
      "If you were to use *, and it returned more columns than you actually needed, "
      "the server would often have to perform more expensive methods to retrieve your "
      "data than it otherwise might. For example, you wouldn't be able to create an index "
      "which simply covered the columns in your SELECT list, and even if you did "
      "(including all columns [shudder]), the next guy who came around and added a column "
      "to the underlying table would cause the optimizer to ignore your optimized covering "
      "index, and you'd likely find that the performance of your query would drop "
      "substantially for no readily apparent reason.";

  std::string message3 =
      "● Binding Problems:  "
      "When you SELECT *, it's possible to retrieve two columns of the same name from two "
      "different tables. This can often crash your data consumer. Imagine a query that joins "
      "two tables, both of which contain a column called \"ID\". How would a consumer know "
      "which was which? SELECT * can also confuse views (at least in some versions SQL Server) "
      "when underlying table structures change -- the view is not rebuilt, and the data which "
      "comes back can be nonsense. And the worst part of it is that you can take care to name "
      "your columns whatever you want, but the next guy who comes along might have no way of "
      "knowing that he has to worry about adding a column which will collide with your "
      "already-developed names.";

  auto message = message1 + "\n" + message2 + "\n" + message3;

  CheckPattern(state,
               sql_statement,
               print_statement,
               pattern,
               RISK_LEVEL_HIGH,
               pattern_type,
               title,
               message,
               true);

}